

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Miter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar4;
  uint fVerbose;
  uint fDualOut;
  int iVar5;
  char *pcVar6;
  uint fSeq;
  uint local_44;
  
  local_44 = 0;
  Extra_UtilGetoptReset();
  fDualOut = 0;
  fSeq = 0;
  bVar1 = false;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"Idstvh"), iVar5 = globalUtilOptind, iVar2 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 < 100) break;
      if (iVar2 == 100) {
        fDualOut = fDualOut ^ 1;
      }
      else if (iVar2 == 0x73) {
        fSeq = fSeq ^ 1;
      }
      else {
        if (iVar2 != 0x74) goto LAB_002243e6;
        bVar1 = (bool)(bVar1 ^ 1);
      }
    }
    if (iVar2 == -1) {
      if (bVar1) {
        pGVar3 = pAbc->pGia;
        if ((pGVar3->vCos->nSize - pGVar3->nRegs & 1U) == 0) {
          pGVar3 = Gia_ManTransformMiter(pGVar3);
          Abc_FrameUpdateGia(pAbc,pGVar3);
          pcVar4 = "The miter (current AIG) is transformed by XORing POs pair-wise.\n";
          iVar5 = 0;
          goto LAB_0022428c;
        }
        pcVar4 = "Abc_CommandAbc9Miter(): The number of outputs should be even.\n";
        goto LAB_002242ca;
      }
      if (argc - globalUtilOptind == 1) {
        pcVar4 = argv[globalUtilOptind];
        pcVar6 = pcVar4;
        do {
          if (*pcVar6 == '>') {
            *pcVar6 = '\\';
          }
          else if (*pcVar6 == '\0') {
            __stream = fopen(pcVar4,"r");
            if (__stream == (FILE *)0x0) {
              Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar4);
              pcVar4 = Extra_FileGetSimilarName
                                 (pcVar4,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
              if (pcVar4 != (char *)0x0) {
                Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
              }
              pcVar4 = "\n";
              iVar5 = 1;
LAB_0022428c:
              iVar2 = 1;
            }
            else {
              fclose(__stream);
              pGVar3 = Gia_AigerRead(pcVar4,0,0);
              if (pGVar3 != (Gia_Man_t *)0x0) {
                pNew = Gia_ManMiter(pAbc->pGia,pGVar3,local_44,fDualOut,fSeq,0,fVerbose);
                Gia_ManStop(pGVar3);
                Abc_FrameUpdateGia(pAbc,pNew);
                return 0;
              }
              pcVar4 = "Reading AIGER has failed.\n";
LAB_002242ca:
              iVar5 = 0;
              iVar2 = -1;
            }
            Abc_Print(iVar2,pcVar4);
            return iVar5;
          }
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
      pcVar4 = "File name is not given on the command line.\n";
      iVar5 = -1;
      goto LAB_002244c6;
    }
    if (iVar2 != 0x49) goto LAB_002243e6;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-I\" should be followed by a char string.\n");
      goto LAB_002243e6;
    }
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)local_44 < 0) {
LAB_002243e6:
      Abc_Print(-2,"usage: &miter [-I num] [-dstvh] <file>\n");
      Abc_Print(-2,"\t         creates miter of two designs (current AIG vs. <file>)\n");
      Abc_Print(-2,"\t-I num : the number of last PIs to replicate [default = %d]\n",(ulong)local_44
               );
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (fDualOut == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle creating dual-output miter [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fSeq == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle creating sequential miter [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle XORing pair-wise POs of the miter [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar4 = "\t<file> : AIGER file with the design to miter\n";
      iVar5 = -2;
LAB_002244c6:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Miter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pAux;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int nInsDup  = 0;
    int fDualOut = 0;
    int fSeq     = 0;
    int fTrans   = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Idstvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a char string.\n" );
                goto usage;
            }
            nInsDup = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsDup < 0 )
                goto usage;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 't':
            fTrans ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fTrans )
    {
        if ( (Gia_ManPoNum(pAbc->pGia) & 1) == 1 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): The number of outputs should be even.\n" );
            return 0;
        }
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): There is no AIG.\n" );
            return 1;
        }
        pAux = Gia_ManTransformMiter( pAbc->pGia );
        Abc_FrameUpdateGia( pAbc, pAux );
        Abc_Print( 1, "The miter (current AIG) is transformed by XORing POs pair-wise.\n" );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    pAux = Gia_ManMiter( pAbc->pGia, pSecond, nInsDup, fDualOut, fSeq, 0, fVerbose );
    Gia_ManStop( pSecond );
    Abc_FrameUpdateGia( pAbc, pAux );
    return 0;

usage:
    Abc_Print( -2, "usage: &miter [-I num] [-dstvh] <file>\n" );
    Abc_Print( -2, "\t         creates miter of two designs (current AIG vs. <file>)\n" );
    Abc_Print( -2, "\t-I num : the number of last PIs to replicate [default = %d]\n", nInsDup );
    Abc_Print( -2, "\t-d     : toggle creating dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating sequential miter [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle XORing pair-wise POs of the miter [default = %s]\n", fTrans? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the design to miter\n");
    return 1;
}